

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall
HVectorBase<double>::saxpy<HighsCDouble,double>
          (HVectorBase<double> *this,HighsCDouble pivotX,HVectorBase<double> *pivot)

{
  long in_RSI;
  HighsCDouble *in_RDI;
  HighsCDouble *this_00;
  double extraout_XMM0_Qa;
  double x1;
  double x0;
  HighsInt iRow;
  HighsInt k;
  double *pivotArray;
  HighsInt *pivotIndex;
  HighsInt pivotCount;
  double *workArray;
  HighsInt *workIndex;
  HighsInt workCount;
  HighsCDouble *in_stack_ffffffffffffff58;
  value_type in_stack_ffffffffffffff60;
  HighsCDouble local_78;
  value_type local_68;
  double local_60;
  int local_58;
  int local_54;
  const_reference local_50;
  const_reference local_48;
  int local_3c;
  reference local_38;
  reference local_30;
  int local_24;
  long local_20;
  
  local_24 = *(int *)((long)&in_RDI->hi + 4);
  local_20 = in_RSI;
  local_30 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&in_RDI->lo,0);
  local_38 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),0);
  local_3c = *(int *)(local_20 + 4);
  local_48 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_20 + 8),0);
  local_50 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),0);
  for (local_54 = 0; local_54 < local_3c; local_54 = local_54 + 1) {
    local_58 = local_48[local_54];
    local_60 = local_38[local_58];
    HighsCDouble::operator*(in_RDI,local_60);
    local_78 = ::operator+(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    this_00 = &local_78;
    local_68 = HighsCDouble::operator_cast_to_double(this_00);
    if ((local_60 == 0.0) && (!NAN(local_60))) {
      local_30[local_24] = local_58;
      local_24 = local_24 + 1;
    }
    std::abs((int)this_00);
    in_stack_ffffffffffffff60 = local_68;
    if (extraout_XMM0_Qa < 1e-14) {
      in_stack_ffffffffffffff60 = 1e-50;
    }
    local_38[local_58] = in_stack_ffffffffffffff60;
  }
  *(int *)((long)&in_RDI->hi + 4) = local_24;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}